

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O0

int h264_residual_cavlc(bitstream *str,h264_slice *slice,int32_t *block,int *num,int cat,int idx,
                       int start,int end,int maxnumcoeff)

{
  int tzVlcIndex;
  h264_slice *phVar1;
  int iVar2;
  uint onebias_00;
  long lVar3;
  int32_t *val;
  uint32_t *val_00;
  undefined8 uStack_a0;
  int32_t iStack_98;
  bool local_91;
  long local_90;
  long local_88;
  int local_80;
  int local_7c;
  int zerosLeft;
  int mode;
  int onebias;
  uint32_t s;
  int suffixLength;
  int local_64;
  uint32_t total_zeros;
  int last;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_48;
  uint local_44;
  int j;
  int i;
  uint32_t trailing_ones;
  uint32_t total_coeff;
  int idx_local;
  int cat_local;
  int *num_local;
  int32_t *block_local;
  h264_slice *slice_local;
  bitstream *str_local;
  
  __vla_expr0 = (unsigned_long)&iStack_98;
  __vla_expr1 = (unsigned_long)(uint)maxnumcoeff;
  local_90 = (long)&iStack_98 - (__vla_expr1 * 4 + 0xf & 0xfffffffffffffff0);
  _total_zeros = (ulong)(uint)maxnumcoeff;
  lVar3 = local_90 - (_total_zeros * 4 + 0xf & 0xfffffffffffffff0);
  local_88 = lVar3;
  trailing_ones = idx;
  total_coeff = cat;
  _idx_local = num;
  num_local = block;
  block_local = (int32_t *)slice;
  slice_local = (h264_slice *)str;
  if (str->dir == VS_ENCODE) {
    i = 0;
    j = 0;
    for (local_44 = 0; (int)local_44 < maxnumcoeff; local_44 = local_44 + 1) {
      if (block[(int)local_44] != 0) {
        if (((int)local_44 < start) || (end < (int)local_44)) {
          *(undefined8 *)(lVar3 + -8) = 0x10807a;
          fprintf(_stderr,"Non-zero coord outside of start..end\n");
          return 1;
        }
        i = i + 1;
        iVar2 = block[(int)local_44];
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        if (iVar2 == 1) {
          j = j + 1;
        }
        else {
          j = 0;
        }
        suffixLength = ((local_44 + 1) - i) - start;
      }
    }
    local_64 = start + -1;
    local_48 = i + -1;
    for (local_44 = 0; (int)local_44 < maxnumcoeff; local_44 = local_44 + 1) {
      if (block[(int)local_44] != 0) {
        *(uint *)(lVar3 + (long)local_48 * 4) = (local_44 - local_64) + -1;
        *(int32_t *)(local_90 + (long)local_48 * 4) = block[(int)local_44];
        local_64 = local_44;
        local_48 = local_48 + -1;
      }
    }
    if (3 < (uint)j) {
      j = 3;
    }
  }
  __vla_expr0 = (unsigned_long)&iStack_98;
  *(undefined8 *)(lVar3 + -8) = 0x108180;
  iVar2 = h264_coeff_token(str,slice,cat,idx,(uint32_t *)&j,(uint32_t *)&i);
  if (iVar2 != 0) {
    return 1;
  }
  if (_idx_local != (int *)0x0) {
    *_idx_local = i;
  }
  if (i != 0) {
    if (((uint)i < 0xb) || (2 < (uint)j)) {
      onebias = 0;
    }
    else {
      onebias = 1;
    }
    for (local_44 = 0; phVar1 = slice_local, tzVlcIndex = i, iVar2 = onebias, local_44 < (uint)i;
        local_44 = local_44 + 1) {
      if (local_44 < (uint)j) {
        mode = (int)(*(int *)(local_90 + (long)(int)local_44 * 4) < 0);
        *(undefined8 *)(lVar3 + -8) = 0x108215;
        iVar2 = vs_u((bitstream *)phVar1,(uint32_t *)&mode,1);
        if (iVar2 != 0) {
          return 1;
        }
        *(int *)(local_90 + (long)(int)local_44 * 4) = mode * -2 + 1;
      }
      else {
        local_91 = local_44 == j && (uint)j < 3;
        onebias_00 = (uint)local_91;
        val = (int32_t *)(local_90 + (long)(int)local_44 * 4);
        zerosLeft = onebias_00;
        *(undefined8 *)(lVar3 + -8) = 0x108298;
        iVar2 = h264_level((bitstream *)phVar1,iVar2,onebias_00,val);
        if (iVar2 != 0) {
          return 1;
        }
        if (onebias == 0) {
          onebias = 1;
        }
        iVar2 = *(int *)(local_90 + (long)(int)local_44 * 4);
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        if ((3 << ((char)onebias - 1U & 0x1f) < iVar2) && (onebias < 6)) {
          onebias = onebias + 1;
        }
      }
    }
    if (total_coeff == 3) {
      local_7c = block_local[0x303];
    }
    else {
      local_7c = 0;
    }
    iVar2 = local_7c;
    if ((uint)i < (end - start) + 1U) {
      *(undefined8 *)(lVar3 + -8) = 0x108345;
      iVar2 = h264_total_zeros((bitstream *)phVar1,iVar2,tzVlcIndex,(uint32_t *)&suffixLength);
      if (iVar2 != 0) {
        return 1;
      }
    }
    else {
      *(undefined8 *)(lVar3 + -8) = 0x10836e;
      iVar2 = vs_infer((bitstream *)phVar1,(uint32_t *)&suffixLength,0);
      if (iVar2 != 0) {
        return 1;
      }
    }
    local_80 = suffixLength;
    for (local_44 = 0; phVar1 = slice_local, iVar2 = local_80, local_44 < i - 1U;
        local_44 = local_44 + 1) {
      val_00 = (uint32_t *)(local_88 + (long)(int)local_44 * 4);
      *(undefined8 *)(lVar3 + -8) = 0x1083c1;
      iVar2 = h264_run_before((bitstream *)phVar1,iVar2,val_00);
      if (iVar2 != 0) {
        return 1;
      }
      local_80 = local_80 - *(int *)(local_88 + (long)(int)local_44 * 4);
      if (local_80 < 0) {
        *(undefined8 *)(lVar3 + -8) = 0x10840a;
        fprintf(_stderr,"zerosLeft underflow\n");
        return 1;
      }
    }
    *(int *)(local_88 + (ulong)(i - 1) * 4) = local_80;
  }
  if (slice_local->nal_ref_idc == 1) {
    for (local_44 = 0; (int)local_44 < maxnumcoeff; local_44 = local_44 + 1) {
      num_local[(int)local_44] = 0;
    }
    local_48 = -1;
    while (local_44 = i + -1, -1 < (int)local_44) {
      local_48 = *(int *)(local_88 + (long)(int)local_44 * 4) + 1 + local_48;
      num_local[start + local_48] = *(int *)(local_90 + (long)(int)local_44 * 4);
      i = local_44;
    }
  }
  return 0;
}

Assistant:

int h264_residual_cavlc(struct bitstream *str, struct h264_slice *slice, int32_t *block, int *num, int cat, int idx, int start, int end, int maxnumcoeff) {
	uint32_t total_coeff, trailing_ones;
	int i, j;
	int32_t tb[maxnumcoeff];
	uint32_t run[maxnumcoeff];
	int last;
	uint32_t total_zeros;
	if (str->dir == VS_ENCODE) {
		total_coeff = 0;
		trailing_ones = 0;
		for (i = 0; i < maxnumcoeff; i++)
			if (block[i]) {
				if (i < start || i > end) {
					fprintf(stderr, "Non-zero coord outside of start..end\n");
					return 1;
				}
				total_coeff++;
				if (abs(block[i]) == 1)
					trailing_ones++;
				else
					trailing_ones = 0;
				total_zeros = i + 1 - total_coeff - start;
			}
		last = start - 1;
		for (i = 0, j = total_coeff - 1; i < maxnumcoeff; i++) {
			if (block[i]) {
				run[j] = i - last - 1;
				tb[j] = block[i];
				last = i;
				j--;
			}
		}
		if (trailing_ones > 3)
			trailing_ones = 3;
	}
	if (h264_coeff_token(str, slice, cat, idx, &trailing_ones, &total_coeff)) return 1;
	if (num)
		*num = total_coeff;
	if (total_coeff) {
		int suffixLength;
		if (total_coeff > 10 && trailing_ones < 3)
			suffixLength = 1;
		else
			suffixLength = 0;
		for (i = 0; i < total_coeff; i++) {
			if (i < trailing_ones) {
				uint32_t s = tb[i] < 0;
				if (vs_u(str, &s, 1)) return 1;
				tb[i] = 1 - 2 * s;
			} else {
				int onebias = (i == trailing_ones && trailing_ones < 3);
				if (h264_level(str, suffixLength, onebias, &tb[i])) return 1;
				if (suffixLength == 0)
					suffixLength = 1;
				if (abs(tb[i]) > (3 << (suffixLength - 1)) && suffixLength < 6)
					suffixLength++;
			}
		}
		int mode;
		if (cat == H264_CTXBLOCKCAT_CHROMA_DC) {
			mode = slice->chroma_array_type;
		} else {
			mode = 0;
		}
		if (total_coeff < end - start + 1) {
			if (h264_total_zeros(str, mode, total_coeff, &total_zeros)) return 1;
		} else {
			if (vs_infer(str, &total_zeros, 0)) return 1;
		}
		int zerosLeft = total_zeros;
		for (i = 0; i < total_coeff - 1; i++) {
			if (h264_run_before(str, zerosLeft, &run[i])) return 1;
			zerosLeft -= run[i];
			if (zerosLeft < 0) {
				fprintf(stderr, "zerosLeft underflow\n");
				return 1;
			}
		}
		run[total_coeff-1] = zerosLeft;
	}
	if (str->dir == VS_DECODE) {
		for (i = 0; i < maxnumcoeff; i++)
			block[i] = 0;
		for (i = total_coeff - 1, j = -1; i >= 0; i--) {
			j += run[i] + 1;
			block[start + j] = tb[i];
		}
	}
	return 0;
}